

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               AvgState<duckdb::hugeint_t> *state,idx_t count,ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  AggregateUnaryInput *pAVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  hugeint_t local_48;
  ulong local_38;
  
  local_38 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar7 = 0;
  pAVar6 = (AggregateUnaryInput *)count;
  local_48.lower = (uint64_t)aggr_input_data;
  local_48.upper = (int64_t)mask;
  do {
    if (uVar7 == count + 0x3f >> 6) {
      return;
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar10 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar10 = count;
      }
LAB_00ad6a12:
      while (uVar3 = uVar9, uVar4 = uVar8, uVar5 = local_38, uVar9 < uVar10) {
        BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
        Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                  ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)state,
                   (AvgState<duckdb::hugeint_t> *)(idata + uVar9),&local_48,pAVar6);
        uVar9 = local_38 + 1;
        uVar8 = uVar9;
        local_38 = uVar9;
      }
    }
    else {
      uVar2 = puVar1[uVar7];
      uVar10 = uVar9 + 0x40;
      if (count <= uVar9 + 0x40) {
        uVar10 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_00ad6a12;
      uVar3 = uVar10;
      uVar4 = uVar10;
      uVar5 = uVar10;
      if (uVar2 != 0) {
        while (uVar3 = uVar8, uVar4 = uVar8, uVar5 = local_38, uVar8 < uVar10) {
          if ((uVar2 >> ((ulong)(uint)((int)uVar8 - (int)uVar9) & 0x3f) & 1) != 0) {
            BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
            Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                      ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)state,
                       (AvgState<duckdb::hugeint_t> *)(idata + uVar8),&local_48,pAVar6);
            uVar8 = local_38;
          }
          uVar8 = uVar8 + 1;
          local_38 = uVar8;
        }
      }
    }
    local_38 = uVar5;
    uVar8 = uVar4;
    uVar9 = uVar3;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}